

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessQueriesTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::DirectStateAccess::Queries::FunctionalTest::iterate(FunctionalTest *this)

{
  ostringstream *this_00;
  uint expected_value;
  GLuint query;
  uint expected_value_00;
  PFNGLGETQUERYBUFFEROBJECT p_Var1;
  PFNGLGETQUERYBUFFEROBJECT p_Var2;
  PFNGLGETQUERYBUFFEROBJECT p_Var3;
  PFNGLGETQUERYBUFFEROBJECT p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  int iVar18;
  ContextType ctxType;
  undefined4 extraout_var;
  undefined4 *puVar19;
  char *description;
  qpTestResult testResult;
  TestContext *this_01;
  unsigned_long expected_value_01;
  long lVar20;
  bool local_1c0;
  bool local_1bf;
  bool local_1be;
  bool local_1bd;
  undefined1 local_1b0 [384];
  
  iVar18 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar20 = CONCAT44(extraout_var,iVar18);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar5 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar6 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar5) || (bVar6)) {
    p_Var1 = *(PFNGLGETQUERYBUFFEROBJECT *)(lVar20 + 0x9e8);
    this->m_pGetQueryBufferObjectiv = p_Var1;
    p_Var2 = *(PFNGLGETQUERYBUFFEROBJECT *)(lVar20 + 0x9f8);
    this->m_pGetQueryBufferObjectuiv = p_Var2;
    p_Var3 = *(PFNGLGETQUERYBUFFEROBJECT *)(lVar20 + 0x9e0);
    this->m_pGetQueryBufferObjecti64v = p_Var3;
    p_Var4 = *(PFNGLGETQUERYBUFFEROBJECT *)(lVar20 + 0x9f0);
    this->m_pGetQueryBufferObjectui64v = p_Var4;
    if ((p_Var1 == (PFNGLGETQUERYBUFFEROBJECT)0x0) ||
       (((p_Var2 == (PFNGLGETQUERYBUFFEROBJECT)0x0 || (p_Var3 == (PFNGLGETQUERYBUFFEROBJECT)0x0)) ||
        (p_Var4 == (PFNGLGETQUERYBUFFEROBJECT)0x0)))) {
      local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      this_00 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,
                      "Test could not get the pointers for glGetQueryBufferObject* functions.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      puVar19 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar19 = 0;
      __cxa_throw(puVar19,&int::typeinfo,0);
    }
    prepareView(this);
    prepareVertexArray(this);
    prepareBuffers(this);
    prepareQueries(this);
    prepareProgram(this);
    draw(this);
    bVar5 = checkView(this);
    bVar6 = checkXFB(this);
    bVar5 = bVar5 && bVar6;
    for (lVar20 = 0; lVar20 != 0x10; lVar20 = lVar20 + 4) {
      expected_value = *(uint *)((long)&s_targets + lVar20);
      bVar6 = checkQueryBufferObject<int>
                        (this,*(GLuint *)((long)this->m_qo + lVar20),0x82ea,expected_value,
                         equal<int>);
      bVar7 = checkQueryBufferObject<unsigned_int>
                        (this,*(GLuint *)((long)this->m_qo + lVar20),0x82ea,expected_value,
                         equal<unsigned_int>);
      bVar8 = checkQueryBufferObject<long>
                        (this,*(GLuint *)((long)this->m_qo + lVar20),0x82ea,(ulong)expected_value,
                         equal<long>);
      bVar9 = checkQueryBufferObject<unsigned_long>
                        (this,*(GLuint *)((long)this->m_qo + lVar20),0x82ea,(ulong)expected_value,
                         equal<unsigned_long>);
      bVar10 = checkQueryBufferObject<int>
                         (this,*(GLuint *)((long)this->m_qo + lVar20),0x8867,1,equal<int>);
      bVar11 = checkQueryBufferObject<unsigned_int>
                         (this,*(GLuint *)((long)this->m_qo + lVar20),0x8867,1,equal<unsigned_int>);
      bVar12 = checkQueryBufferObject<long>
                         (this,*(GLuint *)((long)this->m_qo + lVar20),0x8867,1,equal<long>);
      bVar13 = checkQueryBufferObject<unsigned_long>
                         (this,*(GLuint *)((long)this->m_qo + lVar20),0x8867,1,equal<unsigned_long>)
      ;
      query = *(GLuint *)((long)this->m_qo + lVar20);
      expected_value_00 = *(uint *)((long)&s_results + lVar20);
      expected_value_01 = (unsigned_long)(int)expected_value_00;
      if (expected_value == 0x88bf) {
        local_1bd = checkQueryBufferObject<int>(this,query,0x8866,expected_value_00,less<int>);
        local_1be = checkQueryBufferObject<unsigned_int>
                              (this,*(GLuint *)((long)this->m_qo + lVar20),0x8866,expected_value_00,
                               less<unsigned_int>);
        bVar14 = checkQueryBufferObject<long>
                           (this,*(GLuint *)((long)this->m_qo + lVar20),0x8866,expected_value_01,
                            less<long>);
        local_1bf = checkQueryBufferObject<unsigned_long>
                              (this,*(GLuint *)((long)this->m_qo + lVar20),0x8866,expected_value_01,
                               less<unsigned_long>);
        bVar15 = checkQueryBufferObject<int>
                           (this,*(GLuint *)((long)this->m_qo + lVar20),0x9194,expected_value_00,
                            less<int>);
        local_1c0 = checkQueryBufferObject<unsigned_int>
                              (this,*(GLuint *)((long)this->m_qo + lVar20),0x9194,expected_value_00,
                               less<unsigned_int>);
        bVar16 = checkQueryBufferObject<long>
                           (this,*(GLuint *)((long)this->m_qo + lVar20),0x9194,expected_value_01,
                            less<long>);
        bVar17 = checkQueryBufferObject<unsigned_long>
                           (this,*(GLuint *)((long)this->m_qo + lVar20),0x9194,expected_value_01,
                            less<unsigned_long>);
      }
      else {
        local_1bd = checkQueryBufferObject<int>(this,query,0x8866,expected_value_00,equal<int>);
        local_1be = checkQueryBufferObject<unsigned_int>
                              (this,*(GLuint *)((long)this->m_qo + lVar20),0x8866,expected_value_00,
                               equal<unsigned_int>);
        bVar14 = checkQueryBufferObject<long>
                           (this,*(GLuint *)((long)this->m_qo + lVar20),0x8866,expected_value_01,
                            equal<long>);
        local_1bf = checkQueryBufferObject<unsigned_long>
                              (this,*(GLuint *)((long)this->m_qo + lVar20),0x8866,expected_value_01,
                               equal<unsigned_long>);
        bVar15 = checkQueryBufferObject<int>
                           (this,*(GLuint *)((long)this->m_qo + lVar20),0x9194,expected_value_00,
                            equal<int>);
        local_1c0 = checkQueryBufferObject<unsigned_int>
                              (this,*(GLuint *)((long)this->m_qo + lVar20),0x9194,expected_value_00,
                               equal<unsigned_int>);
        bVar16 = checkQueryBufferObject<long>
                           (this,*(GLuint *)((long)this->m_qo + lVar20),0x9194,expected_value_01,
                            equal<long>);
        bVar17 = checkQueryBufferObject<unsigned_long>
                           (this,*(GLuint *)((long)this->m_qo + lVar20),0x9194,expected_value_01,
                            equal<unsigned_long>);
      }
      bVar5 = (bool)((bVar12 && bVar13) &
                     ((bVar9 && bVar10) && bVar11) & (bVar7 && bVar8) & bVar6 & bVar5 &
                    bVar15 & local_1c0 & bVar16 & bVar14 & local_1bf & local_1bd & local_1be &
                    bVar17);
    }
    clean(this);
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (bVar5 == false) {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
    else {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
  }
  else {
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_01,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult FunctionalTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Fetching access point to GL functions. */
	m_pGetQueryBufferObjectiv	= (PFNGLGETQUERYBUFFEROBJECT)gl.getQueryBufferObjectiv;
	m_pGetQueryBufferObjectuiv   = (PFNGLGETQUERYBUFFEROBJECT)gl.getQueryBufferObjectuiv;
	m_pGetQueryBufferObjecti64v  = (PFNGLGETQUERYBUFFEROBJECT)gl.getQueryBufferObjecti64v;
	m_pGetQueryBufferObjectui64v = (PFNGLGETQUERYBUFFEROBJECT)gl.getQueryBufferObjectui64v;

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	try
	{
		if ((DE_NULL == m_pGetQueryBufferObjectiv) || (DE_NULL == m_pGetQueryBufferObjectuiv) ||
			(DE_NULL == m_pGetQueryBufferObjecti64v) || (DE_NULL == m_pGetQueryBufferObjectui64v))
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Test could not get the pointers for glGetQueryBufferObject* functions."
				<< tcu::TestLog::EndMessage;

			throw 0;
		}

		prepareView();
		prepareVertexArray();
		prepareBuffers();
		prepareQueries();
		prepareProgram();

		draw();

		/* Make sure that framebuffer and transform feedback buffer are filled with expectd data. */
		is_ok &= checkView();
		is_ok &= checkXFB();

		/* Make comparisons for each query object. */
		for (glw::GLuint i = 0; i < s_targets_count; ++i)
		{
			/* Checking targets. */
			is_ok &= checkQueryBufferObject<glw::GLint>(m_qo[i], GL_QUERY_TARGET, s_targets[i],
														&FunctionalTest::equal<glw::GLint>);
			is_ok &= checkQueryBufferObject<glw::GLuint>(m_qo[i], GL_QUERY_TARGET, s_targets[i],
														 &FunctionalTest::equal<glw::GLuint>);
			is_ok &= checkQueryBufferObject<glw::GLint64>(m_qo[i], GL_QUERY_TARGET, s_targets[i],
														  &FunctionalTest::equal<glw::GLint64>);
			is_ok &= checkQueryBufferObject<glw::GLuint64>(m_qo[i], GL_QUERY_TARGET, s_targets[i],
														   &FunctionalTest::equal<glw::GLuint64>);

			/* Checking result availability. */
			is_ok &= checkQueryBufferObject<glw::GLint>(m_qo[i], GL_QUERY_RESULT_AVAILABLE, GL_TRUE,
														&FunctionalTest::equal<glw::GLint>);
			is_ok &= checkQueryBufferObject<glw::GLuint>(m_qo[i], GL_QUERY_RESULT_AVAILABLE, GL_TRUE,
														 &FunctionalTest::equal<glw::GLuint>);
			is_ok &= checkQueryBufferObject<glw::GLint64>(m_qo[i], GL_QUERY_RESULT_AVAILABLE, GL_TRUE,
														  &FunctionalTest::equal<glw::GLint64>);
			is_ok &= checkQueryBufferObject<glw::GLuint64>(m_qo[i], GL_QUERY_RESULT_AVAILABLE, GL_TRUE,
														   &FunctionalTest::equal<glw::GLuint64>);

			if (GL_TIME_ELAPSED == s_targets[i])
			{
				/* Checking result. */
				is_ok &= checkQueryBufferObject<glw::GLint>(m_qo[i], GL_QUERY_RESULT, (glw::GLint)s_results[i],
															&FunctionalTest::less<glw::GLint>);
				is_ok &= checkQueryBufferObject<glw::GLuint>(m_qo[i], GL_QUERY_RESULT, (glw::GLuint)s_results[i],
															 &FunctionalTest::less<glw::GLuint>);
				is_ok &= checkQueryBufferObject<glw::GLint64>(m_qo[i], GL_QUERY_RESULT, (glw::GLint64)s_results[i],
															  &FunctionalTest::less<glw::GLint64>);
				is_ok &= checkQueryBufferObject<glw::GLuint64>(m_qo[i], GL_QUERY_RESULT, (glw::GLuint64)s_results[i],
															   &FunctionalTest::less<glw::GLuint64>);

				/* Checking result (no-wait). */
				is_ok &= checkQueryBufferObject<glw::GLint>(m_qo[i], GL_QUERY_RESULT_NO_WAIT, (glw::GLint)s_results[i],
															&FunctionalTest::less<glw::GLint>);
				is_ok &= checkQueryBufferObject<glw::GLuint>(
					m_qo[i], GL_QUERY_RESULT_NO_WAIT, (glw::GLuint)s_results[i], &FunctionalTest::less<glw::GLuint>);
				is_ok &= checkQueryBufferObject<glw::GLint64>(
					m_qo[i], GL_QUERY_RESULT_NO_WAIT, (glw::GLint64)s_results[i], &FunctionalTest::less<glw::GLint64>);
				is_ok &=
					checkQueryBufferObject<glw::GLuint64>(m_qo[i], GL_QUERY_RESULT_NO_WAIT, (glw::GLuint64)s_results[i],
														  &FunctionalTest::less<glw::GLuint64>);
			}
			else
			{
				/* Checking result. */
				is_ok &= checkQueryBufferObject<glw::GLint>(m_qo[i], GL_QUERY_RESULT, (glw::GLint)s_results[i],
															&FunctionalTest::equal<glw::GLint>);
				is_ok &= checkQueryBufferObject<glw::GLuint>(m_qo[i], GL_QUERY_RESULT, (glw::GLuint)s_results[i],
															 &FunctionalTest::equal<glw::GLuint>);
				is_ok &= checkQueryBufferObject<glw::GLint64>(m_qo[i], GL_QUERY_RESULT, (glw::GLint64)s_results[i],
															  &FunctionalTest::equal<glw::GLint64>);
				is_ok &= checkQueryBufferObject<glw::GLuint64>(m_qo[i], GL_QUERY_RESULT, (glw::GLuint64)s_results[i],
															   &FunctionalTest::equal<glw::GLuint64>);

				/* Checking result (no-wait). */
				is_ok &= checkQueryBufferObject<glw::GLint>(m_qo[i], GL_QUERY_RESULT_NO_WAIT, (glw::GLint)s_results[i],
															&FunctionalTest::equal<glw::GLint>);
				is_ok &= checkQueryBufferObject<glw::GLuint>(
					m_qo[i], GL_QUERY_RESULT_NO_WAIT, (glw::GLuint)s_results[i], &FunctionalTest::equal<glw::GLuint>);
				is_ok &= checkQueryBufferObject<glw::GLint64>(
					m_qo[i], GL_QUERY_RESULT_NO_WAIT, (glw::GLint64)s_results[i], &FunctionalTest::equal<glw::GLint64>);
				is_ok &=
					checkQueryBufferObject<glw::GLuint64>(m_qo[i], GL_QUERY_RESULT_NO_WAIT, (glw::GLuint64)s_results[i],
														  &FunctionalTest::equal<glw::GLuint64>);
			}
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Clean up. */
	clean();

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}